

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config_inl.hpp
# Opt level: O3

string * CLI::detail::ini_join
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,char sepChar,char arrayStart,char arrayEnd,char stringQuote,
                   char literalQuote)

{
  ushort uVar1;
  ctype *pcVar2;
  pointer pbVar3;
  pointer pbVar4;
  long lVar5;
  char cVar6;
  pointer arg;
  bool bVar7;
  bool bVar8;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  ulong local_40;
  pointer local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  arg = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = 0x20 < (ulong)((long)pbVar3 - (long)arg);
  cVar6 = (char)__return_storage_ptr__;
  if (arrayStart != '\0' && bVar7) {
    ::std::__cxx11::string::push_back(cVar6);
    arg = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  pbVar4 = pbVar3;
  if (arg != pbVar3) {
    local_40 = (ulong)(byte)sepChar;
    lVar5 = 0;
    local_48 = args;
    local_38 = pbVar3;
    do {
      bVar8 = lVar5 != 0;
      lVar5 = lVar5 + -1;
      if (bVar8) {
        ::std::__cxx11::string::push_back(cVar6);
        ::std::locale::locale((locale *)&local_68);
        pcVar2 = ::std::use_facet<std::ctype<char>>((locale *)&local_68);
        uVar1 = *(ushort *)(*(long *)(pcVar2 + 0x30) + local_40 * 2);
        ::std::locale::~locale((locale *)&local_68);
        if ((uVar1 >> 0xd & 1) == 0) {
          ::std::__cxx11::string::push_back(cVar6);
        }
      }
      convert_arg_for_ini(&local_68,(string *)arg,stringQuote,literalQuote,
                          arrayStart != '\0' && bVar7);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      arg = (pointer)((string *)arg + 1);
    } while (arg != local_38);
    pbVar3 = (local_48->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = (local_48->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  if ((arrayEnd != '\0') && (0x20 < (ulong)((long)pbVar3 - (long)pbVar4))) {
    ::std::__cxx11::string::push_back(cVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string ini_join(const std::vector<std::string> &args,
                                  char sepChar,
                                  char arrayStart,
                                  char arrayEnd,
                                  char stringQuote,
                                  char literalQuote) {
    bool disable_multi_line{false};
    std::string joined;
    if(args.size() > 1 && arrayStart != '\0') {
        joined.push_back(arrayStart);
        disable_multi_line = true;
    }
    std::size_t start = 0;
    for(const auto &arg : args) {
        if(start++ > 0) {
            joined.push_back(sepChar);
            if(!std::isspace<char>(sepChar, std::locale())) {
                joined.push_back(' ');
            }
        }
        joined.append(convert_arg_for_ini(arg, stringQuote, literalQuote, disable_multi_line));
    }
    if(args.size() > 1 && arrayEnd != '\0') {
        joined.push_back(arrayEnd);
    }
    return joined;
}